

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_red.c
# Opt level: O2

void ppRedPentanomial(word *a,pp_pentanom_st *p)

{
  ulong *puVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  
  uVar9 = p->m;
  bVar3 = (byte)uVar9 & 0x3f;
  uVar8 = uVar9 >> 6;
  uVar12 = uVar9 - p->l1;
  bVar5 = (byte)uVar12 & 0x3f;
  uVar13 = uVar12 >> 6;
  uVar10 = uVar9 - p->l;
  bVar6 = (byte)uVar10 & 0x3f;
  uVar11 = uVar10 >> 6;
  uVar15 = uVar9 - p->k;
  bVar7 = (byte)uVar15 & 0x3f;
  uVar16 = uVar15 >> 6;
  uVar4 = (uVar9 + 0x3f >> 6) * 2;
  while( true ) {
    uVar14 = uVar4 - 1;
    uVar2 = a[uVar14];
    if (uVar14 <= uVar8) break;
    uVar17 = uVar2 << (0x40 - bVar3 & 0x3f);
    if ((uVar9 & 0x3f) == 0) {
      uVar17 = 0;
    }
    a[(uVar4 - 2) - uVar8] = a[(uVar4 - 2) - uVar8] ^ uVar17;
    a[uVar14 - uVar8] = a[uVar14 - uVar8] ^ uVar2 >> bVar3;
    uVar17 = uVar2 << (0x40 - bVar5 & 0x3f);
    if ((uVar12 & 0x3f) == 0) {
      uVar17 = 0;
    }
    a[(uVar4 - 2) - uVar13] = a[(uVar4 - 2) - uVar13] ^ uVar17;
    a[uVar14 - uVar13] = a[uVar14 - uVar13] ^ uVar2 >> bVar5;
    uVar17 = uVar2 << (0x40 - bVar6 & 0x3f);
    if ((uVar10 & 0x3f) == 0) {
      uVar17 = 0;
    }
    a[(uVar4 - 2) - uVar11] = a[(uVar4 - 2) - uVar11] ^ uVar17;
    a[uVar14 - uVar11] = a[uVar14 - uVar11] ^ uVar2 >> bVar6;
    uVar17 = uVar2 << (0x40 - bVar7 & 0x3f);
    if ((uVar15 & 0x3f) == 0) {
      uVar17 = 0;
    }
    a[(uVar4 - 2) - uVar16] = a[(uVar4 - 2) - uVar16] ^ uVar17;
    a[uVar14 - uVar16] = a[uVar14 - uVar16] ^ uVar2 >> bVar7;
    uVar4 = uVar14;
  }
  *a = *a ^ uVar2 >> bVar3;
  uVar9 = (uVar2 >> bVar3) << bVar3;
  if (((uVar12 & 0x3f) != 0) && (uVar13 < uVar14)) {
    a[(uVar4 - 2) - uVar13] = a[(uVar4 - 2) - uVar13] ^ uVar9 << (0x40 - bVar5 & 0x3f);
  }
  a[uVar14 - uVar13] = a[uVar14 - uVar13] ^ uVar9 >> bVar5;
  if (((uVar10 & 0x3f) != 0) && (uVar11 < uVar14)) {
    a[(uVar4 - 2) - uVar11] = a[(uVar4 - 2) - uVar11] ^ uVar9 << (0x40 - bVar6 & 0x3f);
  }
  a[uVar14 - uVar11] = a[uVar14 - uVar11] ^ uVar9 >> bVar6;
  if (((uVar15 & 0x3f) != 0) && (uVar16 < uVar14)) {
    a[(uVar4 - 2) - uVar16] = a[(uVar4 - 2) - uVar16] ^ uVar9 << (0x40 - bVar7 & 0x3f);
  }
  puVar1 = a + uVar14;
  puVar1[-uVar16] = puVar1[-uVar16] ^ uVar9 >> bVar7;
  *puVar1 = *puVar1 ^ uVar9;
  return;
}

Assistant:

void ppRedPentanomial(word a[], const pp_pentanom_st* p)
{
	register word hi;
	size_t mb, mw, l1b, l1w, lb, lw, kb, kw;
	size_t n;
	// pre
	ASSERT(memIsValid(p, sizeof(pp_pentanom_st)));
	ASSERT(wwIsValid(a, 2 * W_OF_B(p->m)));
	ASSERT(p->m > p->k && p->k > p->l && p->l > p->l1 && p->l1 > 0);
	ASSERT(p->k < B_PER_W);
	ASSERT(p->m - p->k >= B_PER_W);
	// разбор пятичлена
	mb = p->m % B_PER_W;
	mw = p->m / B_PER_W;
	l1b = (p->m - p->l1) % B_PER_W;
	l1w = (p->m - p->l1) / B_PER_W;
	lb = (p->m - p->l) % B_PER_W;
	lw = (p->m - p->l) / B_PER_W;
	kb = (p->m - p->k) % B_PER_W;
	kw = (p->m - p->k) / B_PER_W;
	// обрабатываем старшие слова
	for (n = 2 * W_OF_B(p->m); --n > mw;)
	{
		hi = a[n];
		a[n - mw - 1] ^= mb ? hi << (B_PER_W - mb) : 0;
		a[n - mw] ^= hi >> mb;
		a[n - l1w - 1] ^= l1b ? hi << (B_PER_W - l1b) : 0;
		a[n - l1w] ^= hi >> l1b;
		a[n - lw - 1] ^= lb ? hi << (B_PER_W - lb) : 0;
		a[n - lw] ^= hi >> lb;
		a[n - kw - 1] ^= kb ? hi << (B_PER_W - kb) : 0;
		a[n - kw] ^= hi >> kb;
	}
	// слово, на которое попадает моном x^m
	ASSERT(n == mw);
	hi = a[n] >> mb;
	a[0] ^= hi;
	hi <<= mb;
	if (l1w < n && l1b)
		a[n - l1w - 1] ^= hi << (B_PER_W - l1b);
	a[n - l1w] ^= hi >> l1b;
	if (lw < n && lb)
		a[n - lw - 1] ^= hi << (B_PER_W - lb);
	a[n - lw] ^= hi >> lb;
	if (kw < n && kb)
		a[n - kw - 1] ^= hi << (B_PER_W - kb);
	a[n - kw] ^= hi >> kb;
	a[n] ^= hi;
	// очистка
	hi = 0;
}